

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write_int_noinline<char,fmt::v8::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,basic_format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> it;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  appender aVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong value;
  anon_class_8_2_0dfc6556_for_write_digits aVar10;
  ulong uVar11;
  anon_class_12_3_01816715_for_write_digits local_80;
  undefined1 local_70 [32];
  bool local_50;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_48;
  write_int_data<char> data;
  
  pVar1 = specs->type;
  local_48 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  if (pVar1 < string) {
    uVar11 = (ulong)arg >> 0x20;
    uVar7 = arg.prefix;
    uVar9 = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      value = (ulong)arg & 0xffffffff;
      if (((specs->field_0xa & 1) == 0) ||
         (bVar2 = write_int_localized<fmt::v8::appender,unsigned_long,char>
                            ((appender *)&local_48,value,uVar7,specs,loc), !bVar2)) {
        it.container = local_48.container;
        uVar6 = 0x1f;
        if ((uVar9 | 1) != 0) {
          for (; (uVar9 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        aVar10 = (anon_class_8_2_0dfc6556_for_write_digits)
                 (*(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar6 * 8) + value &
                  0xffffffff00000000 | value);
        iVar8 = (int)(*(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar6 * 8) + value >>
                     0x20);
        local_80._0_8_ = aVar10;
        if (specs->precision == -1 && specs->width == 0) {
          to_unsigned<int>(iVar8);
          if (uVar11 != 0) {
            for (uVar7 = uVar7 & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
              local_70[0] = (char)uVar7;
              buffer<char>::push_back(it.container,local_70);
            }
          }
          local_48.container =
               (buffer<char> *)
               write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format.h:1579:41)>
               ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                         ((anon_class_8_2_0dfc6556_for_write_digits *)&local_80,it.container);
        }
        else {
          write_int_data<char>::write_int_data(&data,iVar8,uVar7,specs);
          local_70._8_8_ = data.size;
          local_70._16_8_ = data.padding;
          local_70._0_4_ = uVar7;
          local_70._24_8_ = aVar10;
          local_48.container =
               (buffer<char> *)
               write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_)::_lambda(fmt::v8::appender)_1_>
                         (it.container,specs,data.size,(anon_class_32_3_03e05ccd *)local_70);
        }
      }
      break;
    case oct:
      iVar8 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      bVar3 = (char)(((ushort)iVar8 & 0xff) / 3) + 1;
      if (((specs->field_0x9 & 0x80) != 0) && (uVar9 != 0 && specs->precision <= (int)(uint)bVar3))
      {
        uVar9 = 0x3000;
        if (uVar11 == 0) {
          uVar9 = 0x30;
        }
        uVar7 = (uVar9 | uVar7) + 0x1000000;
      }
      aVar10 = (anon_class_8_2_0dfc6556_for_write_digits)
               ((ulong)arg & 0xffffffff | (ulong)bVar3 << 0x20);
      local_80._0_8_ = aVar10;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>((uint)bVar3);
        if (uVar7 != 0) {
          for (uVar7 = uVar7 & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
            local_70[0] = (char)uVar7;
            buffer<char>::push_back
                      ((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                       local_70);
          }
        }
        local_48.container =
             (buffer<char> *)
             write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format.h:1612:22)>
             ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                       ((anon_class_8_2_0dfc6556_for_write_digits *)&local_80,
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,(uint)bVar3,uVar7,specs);
        local_70._8_8_ = data.size;
        local_70._16_8_ = data.padding;
        local_70._0_4_ = uVar7;
        local_70._24_8_ = aVar10;
        local_48.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_)::_lambda(fmt::v8::appender)_1_>
                       (out,specs,data.size,(anon_class_32_3_03e05ccd *)local_70);
      }
      break;
    case hex_lower:
    case hex_upper:
      local_80.upper = pVar1 == hex_upper;
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar6 = uVar4 << 8;
        if (uVar11 == 0) {
          uVar6 = uVar4;
        }
        uVar7 = (uVar6 | uVar7) + 0x2000000;
      }
      uVar6 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar9 = 8 - ((uVar6 ^ 0x1c) >> 2);
      local_80._0_8_ = (ulong)arg & 0xffffffff | (ulong)uVar9 << 0x20;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(uVar9);
        if (uVar7 != 0) {
          for (uVar7 = uVar7 & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
            local_70[0] = (char)uVar7;
            buffer<char>::push_back
                      ((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                       local_70);
          }
        }
        local_48.container =
             (buffer<char> *)
             write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format.h:1590:41)>
             ::anon_class_40_3_03e05ccd::anon_class_12_3_01816715_for_write_digits::operator()
                       (&local_80,
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,uVar9,uVar7,specs);
        local_70._8_8_ = data.size;
        local_70._16_8_ = data.padding;
        local_70._24_4_ = local_80.abs_value;
        local_70._28_4_ = local_80.num_digits;
        local_50 = local_80.upper;
        local_70._0_4_ = uVar7;
        local_48.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_)::_lambda(fmt::v8::appender)_1_>
                       (out,specs,data.size,(anon_class_40_3_03e05ccd *)local_70);
      }
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar6 = uVar4 << 8;
        if (uVar11 == 0) {
          uVar6 = uVar4;
        }
        uVar7 = (uVar6 | uVar7) + 0x2000000;
      }
      uVar6 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar9 = (uVar6 ^ 0xffffffe0) + 0x21;
      aVar10 = (anon_class_8_2_0dfc6556_for_write_digits)
               ((ulong)arg & 0xffffffff | (ulong)uVar9 << 0x20);
      local_80._0_8_ = aVar10;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(uVar9);
        if (uVar7 != 0) {
          for (uVar7 = uVar7 & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
            local_70[0] = (char)uVar7;
            buffer<char>::push_back
                      ((buffer<char> *)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                       local_70);
          }
        }
        local_48.container =
             (buffer<char> *)
             write_int<fmt::v8::appender,_char,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format.h:1601:22)>
             ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                       ((anon_class_8_2_0dfc6556_for_write_digits *)&local_80,
                        out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      }
      else {
        write_int_data<char>::write_int_data(&data,uVar9,uVar7,specs);
        local_70._8_8_ = data.size;
        local_70._16_8_ = data.padding;
        local_70._0_4_ = uVar7;
        local_70._24_8_ = aVar10;
        local_48.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int<fmt::v8::appender,char,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>(fmt::v8::appender,int,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::write_int<char,fmt::v8::appender,unsigned_int>(fmt::v8::appender,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_)::_lambda(fmt::v8::appender)_1_>
                       (out,specs,data.size,(anon_class_32_3_03e05ccd *)local_70);
      }
      break;
    default:
      goto switchD_00116fab_caseD_7;
    case chr:
      aVar5 = write_char<char,fmt::v8::appender>(out,(char)arg.abs_value,specs);
      return (appender)aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_48.container;
  }
switchD_00116fab_caseD_7:
  throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}